

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O0

void set_v(ALLEGRO_VERTEX *vt,double x,double y,double u,double v)

{
  float *in_RDI;
  double in_XMM0_Qa;
  undefined8 uVar1;
  undefined4 in_XMM1_Da;
  undefined4 uVar2;
  undefined4 in_XMM1_Db;
  undefined4 uVar3;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  double in_XMM3_Qa;
  
  *in_RDI = (float)in_XMM0_Qa;
  in_RDI[1] = (float)(double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  in_RDI[2] = 0.0;
  in_RDI[3] = (float)(double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  in_RDI[4] = (float)in_XMM3_Qa;
  uVar2 = 0x3f800000;
  uVar3 = 0;
  uVar1 = al_map_rgb_f(0x3f800000);
  *(undefined8 *)(in_RDI + 5) = uVar1;
  *(ulong *)(in_RDI + 7) = CONCAT44(uVar3,uVar2);
  return;
}

Assistant:

static void set_v(ALLEGRO_VERTEX *vt, double x, double y, double u, double v)
{
   vt->x = x;
   vt->y = y;
   vt->z = 0;
   vt->u = u;
   vt->v = v;
   vt->color = al_map_rgb_f(1, 1, 1);
}